

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbiw__jpg_processDU
              (stbi__write_context *s,int *bitBuf,int *bitCnt,float *CDU,float *fdtbl,int DC,
              unsigned_short (*HTDC) [2],unsigned_short (*HTAC) [2])

{
  int iVar1;
  bool bVar2;
  float local_178;
  int local_174;
  int nrmarker;
  int lng;
  unsigned_short bits_1 [2];
  int nrzeroes;
  int startpos;
  unsigned_short bits [2];
  float v;
  int DU [64];
  int end0pos;
  int diff;
  int i;
  int dataOff;
  unsigned_short M16zeroes [2];
  unsigned_short EOB [2];
  int DC_local;
  float *fdtbl_local;
  float *CDU_local;
  int *bitCnt_local;
  int *bitBuf_local;
  stbi__write_context *s_local;
  
  dataOff._0_2_ = (*HTAC)[0];
  dataOff._2_2_ = (*HTAC)[1];
  i._0_2_ = HTAC[0xf0][0];
  i._2_2_ = HTAC[0xf0][1];
  M16zeroes = (unsigned_short  [2])DC;
  for (diff = 0; diff < 0x40; diff = diff + 8) {
    stbiw__jpg_DCT(CDU + diff,CDU + (diff + 1),CDU + (diff + 2),CDU + (diff + 3),CDU + (diff + 4),
                   CDU + (diff + 5),CDU + (diff + 6),CDU + (diff + 7));
  }
  for (diff = 0; diff < 8; diff = diff + 1) {
    stbiw__jpg_DCT(CDU + diff,CDU + (diff + 8),CDU + (diff + 0x10),CDU + (diff + 0x18),
                   CDU + (diff + 0x20),CDU + (diff + 0x28),CDU + (diff + 0x30),CDU + (diff + 0x38));
  }
  for (end0pos = 0; end0pos < 0x40; end0pos = end0pos + 1) {
    startpos = (int)(CDU[end0pos] * fdtbl[end0pos]);
    if (0.0 <= (float)startpos) {
      local_178 = (float)startpos + 0.5;
    }
    else {
      local_178 = (float)startpos - 0.5;
    }
    *(int *)(bits + (ulong)""[end0pos] * 2) = (int)local_178;
  }
  if ((int)bits - (int)M16zeroes == 0) {
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,*HTDC);
  }
  else {
    stbiw__jpg_calcBits((int)bits - (int)M16zeroes,(unsigned_short *)&nrzeroes);
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,HTDC[nrzeroes._2_2_]);
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)&nrzeroes);
  }
  DU[0x3f] = 0x3f;
  while( true ) {
    bVar2 = false;
    if (0 < DU[0x3f]) {
      bVar2 = *(int *)(bits + (long)DU[0x3f] * 2) == 0;
    }
    if (!bVar2) break;
    DU[0x3f] = DU[0x3f] + -1;
  }
  if (DU[0x3f] == 0) {
    stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)&dataOff);
    s_local._4_2_ = bits[0];
    s_local._6_2_ = bits[1];
  }
  else {
    for (end0pos = 1; iVar1 = end0pos, end0pos <= DU[0x3f]; end0pos = end0pos + 1) {
      bits_1[0] = (undefined2)end0pos;
      bits_1[1] = end0pos._2_2_;
      for (; *(int *)(bits + (long)end0pos * 2) == 0 && end0pos <= DU[0x3f]; end0pos = end0pos + 1)
      {
      }
      lng = end0pos - iVar1;
      if (0xf < lng) {
        iVar1 = lng >> 4;
        for (local_174 = 1; local_174 <= iVar1; local_174 = local_174 + 1) {
          stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)&i);
        }
        lng = lng & 0xf;
      }
      stbiw__jpg_calcBits(*(int *)(bits + (long)end0pos * 2),(unsigned_short *)&nrmarker);
      stbiw__jpg_writeBits(s,bitBuf,bitCnt,HTAC[(int)(lng * 0x10 + (uint)nrmarker._2_2_)]);
      stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)&nrmarker);
    }
    if (DU[0x3f] != 0x3f) {
      stbiw__jpg_writeBits(s,bitBuf,bitCnt,(unsigned_short *)&dataOff);
    }
    s_local._4_2_ = bits[0];
    s_local._6_2_ = bits[1];
  }
  iVar1._0_2_ = s_local._4_2_;
  iVar1._2_2_ = s_local._6_2_;
  return iVar1;
}

Assistant:

static int stbiw__jpg_processDU(stbi__write_context *s, int *bitBuf, int *bitCnt, float *CDU, float *fdtbl, int DC, const unsigned short HTDC[256][2], const unsigned short HTAC[256][2]) {
   const unsigned short EOB[2] = { HTAC[0x00][0], HTAC[0x00][1] };
   const unsigned short M16zeroes[2] = { HTAC[0xF0][0], HTAC[0xF0][1] };
   int dataOff, i, diff, end0pos;
   int DU[64];

   // DCT rows
   for(dataOff=0; dataOff<64; dataOff+=8) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+1], &CDU[dataOff+2], &CDU[dataOff+3], &CDU[dataOff+4], &CDU[dataOff+5], &CDU[dataOff+6], &CDU[dataOff+7]);
   }
   // DCT columns
   for(dataOff=0; dataOff<8; ++dataOff) {
      stbiw__jpg_DCT(&CDU[dataOff], &CDU[dataOff+8], &CDU[dataOff+16], &CDU[dataOff+24], &CDU[dataOff+32], &CDU[dataOff+40], &CDU[dataOff+48], &CDU[dataOff+56]);
   }
   // Quantize/descale/zigzag the coefficients
   for(i=0; i<64; ++i) {
      float v = CDU[i]*fdtbl[i];
      // DU[stbiw__jpg_ZigZag[i]] = (int)(v < 0 ? ceilf(v - 0.5f) : floorf(v + 0.5f));
      // ceilf() and floorf() are C99, not C89, but I /think/ they're not needed here anyway?
      DU[stbiw__jpg_ZigZag[i]] = (int)(v < 0 ? v - 0.5f : v + 0.5f);
   }

   // Encode DC
   diff = DU[0] - DC;
   if (diff == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[0]);
   } else {
      unsigned short bits[2];
      stbiw__jpg_calcBits(diff, bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTDC[bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   // Encode ACs
   end0pos = 63;
   for(; (end0pos>0)&&(DU[end0pos]==0); --end0pos) {
   }
   // end0pos = first element in reverse order !=0
   if(end0pos == 0) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
      return DU[0];
   }
   for(i = 1; i <= end0pos; ++i) {
      int startpos = i;
      int nrzeroes;
      unsigned short bits[2];
      for (; DU[i]==0 && i<=end0pos; ++i) {
      }
      nrzeroes = i-startpos;
      if ( nrzeroes >= 16 ) {
         int lng = nrzeroes>>4;
         int nrmarker;
         for (nrmarker=1; nrmarker <= lng; ++nrmarker)
            stbiw__jpg_writeBits(s, bitBuf, bitCnt, M16zeroes);
         nrzeroes &= 15;
      }
      stbiw__jpg_calcBits(DU[i], bits);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, HTAC[(nrzeroes<<4)+bits[1]]);
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, bits);
   }
   if(end0pos != 63) {
      stbiw__jpg_writeBits(s, bitBuf, bitCnt, EOB);
   }
   return DU[0];
}